

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O2

void __thiscall hwnet::TCPListener::Do(TCPListener *this)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  Addr *this_00;
  bool bVar3;
  undefined1 local_f8 [120];
  undefined1 local_80 [8];
  sockaddr addr_;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Addr *local_60;
  function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)> *local_58;
  __weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *local_50;
  int local_44;
  pthread_mutex_t *ppStack_40;
  int fd_;
  lock_guard<std::mutex> guard;
  socklen_t len;
  
  this_00 = &this->addr;
  ppStack_40 = (pthread_mutex_t *)&this->mtx;
  local_50 = (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<hwnet::TCPListener>;
  local_58 = &this->onNewConn_;
  local_60 = this_00;
  do {
    guard._M_device._4_4_ = Addr::AddrLen(this_00);
    __mutex = ppStack_40;
    std::mutex::lock((mutex *)&ppStack_40->__data);
    iVar1 = this->readableVer;
    pthread_mutex_unlock(__mutex);
    iVar2 = accept(this,(int)&local_44,(sockaddr *)local_80,
                   (socklen_t *)((long)&guard._M_device + 4));
    if (iVar2 == 0xb) {
      std::mutex::lock((mutex *)&ppStack_40->__data);
      iVar2 = this->readableVer;
      bVar3 = iVar1 == iVar2;
      if (bVar3) {
        this->doing = false;
      }
      pthread_mutex_unlock(ppStack_40);
      this_00 = local_60;
      if (iVar1 != iVar2) goto LAB_0011f191;
    }
    else {
      if (iVar2 == 0) {
        std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPListener,void>
                  ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)
                   (addr_.sa_data + 6),local_50);
        iVar1 = local_44;
        Addr::MakeBySockAddr((Addr *)local_f8,(sockaddr *)local_80,guard._M_device._4_4_);
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>
        ::operator()(local_58,(shared_ptr<hwnet::TCPListener> *)(addr_.sa_data + 6),iVar1,
                     (Addr *)local_f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      }
      else if ((this->onError_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPListener,void>
                  ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)local_f8,local_50)
        ;
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int)>::operator()
                  (&this->onError_,(shared_ptr<hwnet::TCPListener> *)local_f8,iVar2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
        return;
      }
LAB_0011f191:
      bVar3 = false;
      if (((this->stop)._M_base._M_i & 1U) != 0) {
        return;
      }
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void TCPListener::Do() {
	for(;;) {
		struct sockaddr addr_;
		socklen_t len = this->addr.AddrLen();
		int       fd_;
		this->mtx.lock();		
		auto localVer = this->readableVer;
		this->mtx.unlock();
		auto err = this->accept(&fd_,&addr_,&len);
		if(0 == err) {
			this->onNewConn_(shared_from_this(),fd_,Addr::MakeBySockAddr(&addr_,len));
		} else {
			if(err == EAGAIN) {
				std::lock_guard<std::mutex> guard(this->mtx);
				if(localVer == this->readableVer) {
					this->doing = false;
					break;
				}
			} else {
				if(nullptr != this->onError_){
					this->onError_(shared_from_this(),err);
					break;
				}
			}
		}
		if(this->stop.load() == true) {
			break;
		}
	}
}